

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_sync.cpp
# Opt level: O3

bool __thiscall
VerboseVerification<boost::asio::ssl::host_name_verification>::operator()
          (VerboseVerification<boost::asio::ssl::host_name_verification> *this,bool preverified,
          verify_context *ctx)

{
  bool bVar1;
  X509 *a;
  X509_NAME *a_00;
  size_t sVar2;
  ostream *poVar3;
  char subject_name [256];
  char acStack_128 [264];
  
  a = X509_STORE_CTX_get_current_cert((X509_STORE_CTX *)ctx->handle_);
  a_00 = X509_get_subject_name(a);
  X509_NAME_oneline(a_00,acStack_128,0x100);
  bVar1 = boost::asio::ssl::host_name_verification::operator()(&this->verifier_,preverified,ctx);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Verifying: ",0xb);
  sVar2 = strlen(acStack_128);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,acStack_128,sVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Verified: ",10);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return bVar1;
}

Assistant:

bool operator()(bool preverified, ssl::verify_context& ctx) {
    char subject_name[256];
    X509* cert = X509_STORE_CTX_get_current_cert(ctx.native_handle());
    X509_NAME_oneline(X509_get_subject_name(cert), subject_name, 256);

    bool verified = verifier_(preverified, ctx);
    std::cout << "Verifying: " << subject_name << std::endl;
    std::cout << "Verified: " << verified << std::endl;
    return verified;
  }